

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsstyle.cpp
# Opt level: O1

QSize __thiscall
QWindowsStyle::sizeFromContents
          (QWindowsStyle *this,ContentsType ct,QStyleOption *opt,QSize *csz,QWidget *widget)

{
  long lVar1;
  qreal qVar2;
  qreal qVar3;
  char cVar4;
  int iVar5;
  undefined4 uVar6;
  uint uVar7;
  int iVar8;
  QSize QVar9;
  QStyle *pQVar10;
  int extraout_var;
  qsizetype qVar11;
  QSize QVar12;
  Representation RVar13;
  QStyleOption *pQVar14;
  int iVar15;
  Representation RVar16;
  QStyle *pQVar17;
  QSize QVar18;
  long in_FS_OFFSET;
  QFontMetrics fmBold;
  QFontMetrics fm;
  undefined1 *local_58;
  undefined1 *local_50;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (CT_MenuBarItem < ct) goto switchD_003b1bac_caseD_1;
  QVar12 = *csz;
  pQVar17 = (QStyle *)((ulong)QVar12 >> 0x20);
  RVar13 = QVar12.wd.m_i;
  switch(ct) {
  case CT_PushButton:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar14 = opt, opt->type != 2)) {
      pQVar14 = (QStyleOption *)0x0;
    }
    if (pQVar14 != (QStyleOption *)0x0) {
      iVar5 = 0;
      QVar9 = QCommonStyle::sizeFromContents(&this->super_QCommonStyle,CT_PushButton,opt,csz,widget)
      ;
      if ((pQVar14[1].version & 8) != 0) {
        pQVar17 = QStyle::proxy((QStyle *)((ulong)QVar9 >> 0x20));
        iVar5 = (**(code **)(*(long *)pQVar17 + 0xe0))(pQVar17,1,pQVar14,widget);
        iVar5 = iVar5 * 2;
      }
      qVar2 = QStyleHelper::dpi(opt);
      qVar3 = QStyleHelper::dpiScaled(75.0,qVar2);
      qVar2 = QStyleHelper::dpiScaled(23.0,qVar2);
      QVar18.wd.m_i = (int)qVar3 + iVar5;
      QVar12 = QVar9;
      if ((QVar9.wd.m_i.m_i < (int)QVar18.wd.m_i) &&
         (lVar1._0_4_ = pQVar14[1].rect.x2, lVar1._4_4_ = pQVar14[1].rect.y2, QVar18.ht.m_i = 0,
         QVar12 = QVar18, lVar1 == 0)) {
        QVar12 = (QSize)((ulong)QVar9 & 0xffffffff);
      }
      pQVar17 = (QStyle *)(ulong)(uint)(iVar5 + (int)qVar2);
      if (iVar5 + (int)qVar2 <= QVar9.ht.m_i.m_i) {
        pQVar17 = (QStyle *)((ulong)QVar9 >> 0x20);
      }
    }
    break;
  case CT_ToolButton:
    if (((opt != (QStyleOption *)0x0) && (0 < opt->version)) && (opt->type == 0xf0003)) {
      QVar12 = (QSize)(((ulong)(RVar13.m_i + 7) | (ulong)QVar12 & 0xffffffff00000000) + 0x600000000)
      ;
      goto LAB_003b1e03;
    }
  default:
switchD_003b1bac_caseD_1:
    QVar12 = QCommonStyle::sizeFromContents(&this->super_QCommonStyle,ct,opt,csz,widget);
    pQVar17 = (QStyle *)((ulong)QVar12 >> 0x20);
    break;
  case CT_MenuItem:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar14 = opt, opt->type != 4)) {
      pQVar14 = (QStyleOption *)0x0;
    }
    if (pQVar14 != (QStyleOption *)0x0) {
      QVar9 = QCommonStyle::sizeFromContents(&this->super_QCommonStyle,CT_MenuItem,opt,csz,widget);
      pQVar17 = (QStyle *)0x9;
      if (pQVar14[1].version != 2) {
        pQVar17 = (QStyle *)(ulong)(uint)QVar9.ht.m_i.m_i;
        cVar4 = QIcon::isNull();
        if (cVar4 != '\0') {
          pQVar17 = (QStyle *)(ulong)(QVar9.ht.m_i.m_i - 2);
          QVar12.wd.m_i = RVar13.m_i - 6;
          QVar12.ht.m_i = 0;
        }
      }
      RVar13 = QVar12.wd.m_i;
      if (pQVar14[1].version != 2) {
        pQVar10 = (QStyle *)QIcon::isNull();
        if ((char)pQVar10 == '\0') {
          pQVar10 = QStyle::proxy(pQVar10);
          uVar6 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x3e,opt,widget);
          local_48.m_size = CONCAT44(uVar6,uVar6);
          QIcon::actualSize((QSize *)&pQVar14[1].styleObject,(Mode)&local_48,On);
          uVar7 = extraout_var + 4U;
          if ((int)(extraout_var + 4U) < (int)(uint)pQVar17) {
            uVar7 = (uint)pQVar17;
          }
          pQVar17 = (QStyle *)(ulong)uVar7;
        }
      }
      iVar5 = pQVar14[2].version;
      local_48.m_data = (storage_type_conflict *)pQVar14[1].palette.d;
      local_48.m_size = *(qsizetype *)&pQVar14[1].palette.currentGroup;
      qVar11 = QStringView::indexOf(&local_48,(QChar)0x9,0,CaseSensitive);
      if (qVar11 == -1) {
        if (pQVar14[1].version == 1) {
          iVar15 = (int)pQVar14 + 0x60;
          local_50 = &DAT_aaaaaaaaaaaaaaaa;
          QFontMetrics::QFontMetrics((QFontMetrics *)&local_50,(QFont *)&pQVar14[2].state);
          local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
          QFont::QFont((QFont *)&local_48,(QFont *)&pQVar14[2].state);
          QFont::setWeight((Weight)&local_48);
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          QFontMetrics::QFontMetrics((QFontMetrics *)&local_58,(QFont *)&local_48);
          iVar8 = QFontMetrics::horizontalAdvance((QString *)&local_58,iVar15);
          iVar15 = QFontMetrics::horizontalAdvance((QString *)&local_50,iVar15);
          RVar13.m_i = (iVar8 + RVar13.m_i) - iVar15;
          QFontMetrics::~QFontMetrics((QFontMetrics *)&local_58);
          QFont::~QFont((QFont *)&local_48);
          QFontMetrics::~QFontMetrics((QFontMetrics *)&local_50);
        }
        else if (pQVar14[1].version == 3) {
          RVar13.m_i = RVar13.m_i + 0xc;
        }
      }
      else {
        RVar13.m_i = RVar13.m_i + 0x14;
      }
      iVar8 = 0xc;
      if (0xc < iVar5) {
        iVar8 = iVar5;
      }
      QVar12.wd.m_i = RVar13.m_i + iVar8 + 0x19;
      QVar12.ht.m_i = 0;
    }
    break;
  case CT_MenuBarItem:
    RVar16 = QVar12.ht.m_i;
    if (0 < RVar16.m_i && 0 < RVar13.m_i) {
      QVar12.wd.m_i = RVar13.m_i + 0xc;
      QVar12.ht.m_i = 0;
      pQVar17 = (QStyle *)(ulong)(RVar16.m_i + 4);
    }
  }
  QVar12 = (QSize)((ulong)QVar12 & 0xffffffff | (long)pQVar17 << 0x20);
LAB_003b1e03:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return QVar12;
}

Assistant:

QSize QWindowsStyle::sizeFromContents(ContentsType ct, const QStyleOption *opt,
                                      const QSize &csz, const QWidget *widget) const
{
    QSize sz(csz);
    switch (ct) {
    case CT_PushButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);
            int w = sz.width(),
                h = sz.height();
            int defwidth = 0;
            if (btn->features & QStyleOptionButton::AutoDefaultButton)
                defwidth = 2 * proxy()->pixelMetric(PM_ButtonDefaultIndicator, btn, widget);
            const qreal dpi = QStyleHelper::dpi(opt);
            int minwidth = int(QStyleHelper::dpiScaled(75, dpi));
            int minheight = int(QStyleHelper::dpiScaled(23, dpi));

            if (w < minwidth + defwidth && !btn->text.isEmpty())
                w = minwidth + defwidth;
            if (h < minheight + defwidth)
                h = minheight + defwidth;

            sz = QSize(w, h);
        }
        break;
#if QT_CONFIG(menu)
    case CT_MenuItem:
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            int w = sz.width();
            sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);

            if (mi->menuItemType == QStyleOptionMenuItem::Separator) {
                sz = QSize(10, QWindowsStylePrivate::windowsSepHeight);
            }
            else if (mi->icon.isNull()) {
                sz.setHeight(sz.height() - 2);
                w -= 6;
            }

            if (mi->menuItemType != QStyleOptionMenuItem::Separator && !mi->icon.isNull()) {
                int iconExtent = proxy()->pixelMetric(PM_SmallIconSize, opt, widget);
                sz.setHeight(qMax(sz.height(),
                                  mi->icon.actualSize(QSize(iconExtent, iconExtent)).height()
                                  + 2 * QWindowsStylePrivate::windowsItemFrame));
            }
            int maxpmw = mi->maxIconWidth;
            int tabSpacing = 20;
            if (mi->text.contains(u'\t'))
                w += tabSpacing;
            else if (mi->menuItemType == QStyleOptionMenuItem::SubMenu)
                w += 2 * QWindowsStylePrivate::windowsArrowHMargin;
            else if (mi->menuItemType == QStyleOptionMenuItem::DefaultItem) {
                // adjust the font and add the difference in size.
                // it would be better if the font could be adjusted in the initStyleOption qmenu func!!
                QFontMetrics fm(mi->font);
                QFont fontBold = mi->font;
                fontBold.setBold(true);
                QFontMetrics fmBold(fontBold);
                w += fmBold.horizontalAdvance(mi->text) - fm.horizontalAdvance(mi->text);
            }

            int checkcol = qMax<int>(maxpmw, QWindowsStylePrivate::windowsCheckMarkWidth); // Windows always shows a check column
            w += checkcol;
            w += int(QWindowsStylePrivate::windowsRightBorder) + 10;
            sz.setWidth(w);
        }
        break;
#endif // QT_CONFIG(menu)
#if QT_CONFIG(menubar)
    case CT_MenuBarItem:
        if (!sz.isEmpty())
            sz += QSize(QWindowsStylePrivate::windowsItemHMargin * 4, QWindowsStylePrivate::windowsItemVMargin * 2);
        break;
#endif
    case CT_ToolButton:
        if (qstyleoption_cast<const QStyleOptionToolButton *>(opt))
            return sz += QSize(7, 6);
        Q_FALLTHROUGH();

    default:
        sz = QCommonStyle::sizeFromContents(ct, opt, csz, widget);
    }
    return sz;
}